

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  uint uVar2;
  u8 *puVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  undefined6 in_register_00000012;
  int iVar12;
  ulong uVar13;
  undefined6 in_register_00000032;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  int local_4c;
  ushort local_48;
  
  local_4c = (int)CONCAT62(in_register_00000012,iSize);
  uVar9 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar15 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  uVar11 = local_4c + uVar9;
  puVar3 = pPage->aData;
  uVar13 = (ulong)pPage->hdrOffset;
  uVar1 = uVar13 + 1;
  uVar6 = uVar1;
  if ((puVar3[uVar13 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    local_48 = 0;
    uVar16 = uVar1;
LAB_0013a3a3:
    uVar6 = uVar15 & 0xffff;
    uVar9 = (uint)(ushort)(*(ushort *)(puVar3 + uVar13 + 5) << 8 |
                          *(ushort *)(puVar3 + uVar13 + 5) >> 8);
    if (uVar9 < (uint)uVar6) {
      *(ushort *)(puVar3 + uVar16) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
    }
    else {
      if (((uint)uVar6 < uVar9) || ((uint)uVar1 != (uint)uVar16)) {
        uVar10 = 0xfcac;
        goto LAB_0013a1da;
      }
      *(ushort *)(puVar3 + uVar1) = local_48 << 8 | local_48 >> 8;
      puVar3[uVar13 + 5] = (u8)(uVar11 >> 8);
      puVar3[uVar13 + 6] = (u8)uVar11;
    }
    if ((pPage->pBt->btsFlags & 0xc) != 0) {
      memset(puVar3 + uVar6,0,(ulong)(ushort)local_4c);
    }
    puVar3[uVar6] = (u8)(local_48 >> 8);
    puVar3[uVar6 + 1] = (u8)local_48;
    puVar3[uVar6 + 2] = (u8)((uint)local_4c >> 8);
    puVar3[uVar6 + 3] = (u8)local_4c;
    pPage->nFree = pPage->nFree + iSize;
    iVar12 = 0;
  }
  else {
    do {
      uVar16 = uVar6;
      uVar7 = *(ushort *)(puVar3 + uVar16);
      local_48 = uVar7 << 8 | uVar7 >> 8;
      uVar6 = (ulong)local_48;
      uVar8 = (uint)local_48;
      uVar4 = (uint)uVar16;
      if ((ushort)uVar15 <= local_48) goto LAB_0013a1a8;
    } while (uVar4 + 4 <= uVar8);
    if (local_48 == 0) {
LAB_0013a1a8:
      uVar2 = pPage->pBt->usableSize;
      if (uVar2 - 4 < uVar8) {
        uVar10 = 0xfc82;
      }
      else if (uVar11 + 3 < uVar8 || local_48 == 0) {
        bVar14 = 0;
LAB_0013a223:
        if ((uint)uVar1 < uVar4) {
          uVar7 = *(ushort *)(puVar3 + uVar16 + 2) << 8 | *(ushort *)(puVar3 + uVar16 + 2) >> 8;
          bVar5 = true;
          if (uVar9 <= uVar7 + uVar4 + 3) {
            uVar8 = uVar7 + uVar4;
            if (uVar9 < uVar8) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc9e,
                          "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
              bVar5 = false;
            }
            else {
              bVar14 = bVar14 + ((char)iStart - (char)uVar8);
              local_4c = uVar11 - uVar4;
              uVar15 = uVar16;
              bVar5 = true;
            }
          }
          if (!bVar5) {
            return 0xb;
          }
        }
        if (bVar14 <= puVar3[uVar13 + 7]) {
          puVar3[uVar13 + 7] = puVar3[uVar13 + 7] - bVar14;
          goto LAB_0013a3a3;
        }
        uVar10 = 0xfca4;
      }
      else {
        bVar14 = (char)(uVar7 >> 8) - (char)uVar11;
        if (local_48 < uVar11) {
          uVar10 = 0xfc8e;
        }
        else {
          uVar11 = (ushort)(*(ushort *)(puVar3 + uVar6 + 2) << 8 |
                           *(ushort *)(puVar3 + uVar6 + 2) >> 8) + uVar8;
          if (uVar11 <= uVar2) {
            local_4c = uVar11 - uVar9;
            local_48 = *(ushort *)(puVar3 + uVar6) << 8 | *(ushort *)(puVar3 + uVar6) >> 8;
            goto LAB_0013a223;
          }
          uVar10 = 0xfc91;
        }
      }
    }
    else {
      uVar10 = 0xfc7d;
    }
LAB_0013a1da:
    iVar12 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  }
  return iVar12;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  x = get2byte(&data[hdr+5]);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x || iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}